

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::GetNodeWithValidCharacterSet
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,EncodedChar cc)

{
  CharSet<char16_t> *this_00;
  code *pcVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  _func_int **pp_Var7;
  undefined4 *puVar8;
  Node *pNVar9;
  NodeTag *this_01;
  
  if ((((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) &&
     (this->unicodeFlagPresent == true)) {
    puVar3 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
    *(undefined4 *)(puVar3 + 1) = 0xb;
    *(uint *)((long)puVar3 + 0xc) = *(uint *)((long)puVar3 + 0xc) & 0xffff8000;
    puVar3[2] = 0;
    puVar3[3] = 0;
    *(undefined4 *)(puVar3 + 4) = 0;
    *(undefined8 *)((long)puVar3 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar3 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x34) = 0xffffffff;
    *puVar3 = &PTR_LiteralLength_01558fd0;
    *(undefined2 *)(puVar3 + 7) = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar3 + 8));
    CharSet<char16_t>::SetRange
              ((CharSet<char16_t> *)(puVar3 + 8),this->ctAllocator,L'\xd800',L'\xdbff');
    puVar4 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
    *(undefined4 *)(puVar4 + 1) = 0xb;
    *(uint *)((long)puVar4 + 0xc) = *(uint *)((long)puVar4 + 0xc) & 0xffff8000;
    puVar4[2] = 0;
    puVar4[3] = 0;
    *(undefined4 *)(puVar4 + 4) = 0;
    *(undefined8 *)((long)puVar4 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar4 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar4 + 0x34) = 0xffffffff;
    *puVar4 = &PTR_LiteralLength_01558fd0;
    *(undefined2 *)(puVar4 + 7) = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar4 + 8));
    CharSet<char16_t>::SetRange
              ((CharSet<char16_t> *)(puVar4 + 8),this->ctAllocator,L'\xdc00',L'\xdfff');
    puVar5 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
    puVar6 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
    *(undefined4 *)(puVar6 + 1) = 6;
    *(uint *)((long)puVar6 + 0xc) = *(uint *)((long)puVar6 + 0xc) & 0xffff8000;
    puVar6[2] = 0;
    puVar6[3] = 0;
    *(undefined4 *)(puVar6 + 4) = 0;
    *(undefined8 *)((long)puVar6 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar6 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x34) = 0xffffffff;
    *puVar6 = &PTR_LiteralLength_015590b0;
    puVar6[7] = puVar4;
    puVar6[8] = 0;
    *(undefined4 *)(puVar5 + 1) = 6;
    *(uint *)((long)puVar5 + 0xc) = *(uint *)((long)puVar5 + 0xc) & 0xffff8000;
    puVar5[2] = 0;
    puVar5[3] = 0;
    *(undefined4 *)(puVar5 + 4) = 0;
    *(undefined8 *)((long)puVar5 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar5 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar5 + 0x34) = 0xffffffff;
    *puVar5 = &PTR_LiteralLength_015590b0;
    puVar5[7] = puVar3;
    puVar5[8] = puVar6;
    pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
    *(undefined4 *)(pp_Var7 + 1) = 0xb;
    *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
    pp_Var7[2] = (_func_int *)0x0;
    pp_Var7[3] = (_func_int *)0x0;
    *(undefined4 *)(pp_Var7 + 4) = 0;
    *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
    *pp_Var7 = (_func_int *)&PTR_LiteralLength_01558fd0;
    *(undefined2 *)(pp_Var7 + 7) = 0x100;
    this_00 = (CharSet<char16_t> *)(pp_Var7 + 8);
    CharSet<char16_t>::CharSet(this_00);
    if ((ushort)cc < 0x53) {
      if (cc == L'.') {
        if (this->dotAllFlagPresent == true) {
          StandardChars<char16_t>::SetFullSet(this->standardChars,this->ctAllocator,this_00);
        }
        else {
          StandardChars<char16_t>::SetNonNewline(this->standardChars,this->ctAllocator,this_00);
        }
        goto LAB_00ece365;
      }
      if (cc == L'D') {
        StandardChars<char16_t>::SetNonDigits(this->standardChars,this->ctAllocator,this_00);
        goto LAB_00ece365;
      }
    }
    else {
      if (cc == L'S') {
        StandardChars<char16_t>::SetNonWhitespace(this->standardChars,this->ctAllocator,this_00);
        goto LAB_00ece365;
      }
      if (cc == L'W') {
        if (this->caseInsensitiveFlagPresent == true) {
          StandardChars<char16_t>::SetNonWordIUChars(this->standardChars,this->ctAllocator,this_00);
        }
        else {
          StandardChars<char16_t>::SetNonWordChars(this->standardChars,this->ctAllocator,this_00);
        }
        goto LAB_00ece365;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc41,"(false)","");
    if (bVar2) {
      *puVar8 = 0;
LAB_00ece365:
      CharSet<char16_t>::SubtractRange(this_00,this->ctAllocator,L'\xd800',L'\xdbff');
      puVar3 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar3 + 1) = 0xb;
      *(uint *)((long)puVar3 + 0xc) = *(uint *)((long)puVar3 + 0xc) & 0xffff8000;
      puVar3[2] = 0;
      puVar3[3] = 0;
      *(undefined4 *)(puVar3 + 4) = 0;
      *(undefined8 *)((long)puVar3 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar3 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar3 + 0x34) = 0xffffffff;
      *puVar3 = &PTR_LiteralLength_01558fd0;
      *(undefined2 *)(puVar3 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar3 + 8));
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(puVar3 + 8),this->ctAllocator,L'\xd800',L'\xdbff');
      pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
      puVar4 = (undefined8 *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
      puVar6 = (undefined8 *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
      *(undefined4 *)(puVar6 + 1) = 7;
      *(uint *)((long)puVar6 + 0xc) = *(uint *)((long)puVar6 + 0xc) & 0xffff8000;
      puVar6[2] = 0;
      puVar6[3] = 0;
      *(undefined4 *)(puVar6 + 4) = 0;
      *(undefined8 *)((long)puVar6 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar6 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar6 + 0x34) = 0xffffffff;
      *puVar6 = &PTR_LiteralLength_01559190;
      puVar6[7] = puVar3;
      *(undefined4 *)(puVar6 + 0xb) = 0;
      puVar6[8] = 0;
      puVar6[9] = 0;
      *(undefined8 *)((long)puVar6 + 0x4d) = 0;
      *(undefined4 *)(puVar4 + 1) = 7;
      *(uint *)((long)puVar4 + 0xc) = *(uint *)((long)puVar4 + 0xc) & 0xffff8000;
      puVar4[2] = 0;
      puVar4[3] = 0;
      *(undefined4 *)(puVar4 + 4) = 0;
      *(undefined8 *)((long)puVar4 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar4 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar4 + 0x34) = 0xffffffff;
      *puVar4 = &PTR_LiteralLength_01559190;
      puVar4[7] = puVar5;
      puVar4[8] = puVar6;
      puVar4[9] = 0;
      *(undefined4 *)(puVar4 + 10) = 0;
      *(undefined1 *)((long)puVar4 + 0x54) = 0;
      *(undefined4 *)(puVar4 + 0xb) = 0;
      pNVar9->tag = Alt;
      pNVar9->features = 0;
      *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
      (pNVar9->prevConsumes).lower = 0;
      pNVar9->firstSet = (CharSet<char16_t> *)0x0;
      pNVar9->followSet = (CharSet<char16_t> *)0x0;
      *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
      (pNVar9->followConsumes).upper = 0xffffffff;
      pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pNVar9[1]._vptr_Node = pp_Var7;
      *(undefined8 **)&pNVar9[1].tag = puVar4;
      pNVar9[1].firstSet = (CharSet<char16_t> *)0x0;
      *(undefined4 *)&pNVar9[1].followSet = 0;
      *(undefined1 *)((long)&pNVar9[1].followSet + 4) = 0;
      pNVar9[1].prevConsumes.lower = 0;
      return pNVar9;
    }
  }
  else {
    pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
    pNVar9->tag = MatchSet;
    pNVar9->features = 0;
    *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
    pNVar9->firstSet = (CharSet<char16_t> *)0x0;
    pNVar9->followSet = (CharSet<char16_t> *)0x0;
    (pNVar9->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
    (pNVar9->followConsumes).upper = 0xffffffff;
    pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
    *(undefined2 *)&pNVar9[1]._vptr_Node = 0x100;
    this_01 = &pNVar9[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)this_01);
    if ((ushort)cc < 0x53) {
      if (cc == L'.') {
        if (this->dotAllFlagPresent == true) {
          StandardChars<char16_t>::SetFullSet
                    (this->standardChars,this->ctAllocator,(CharSet<char16_t> *)this_01);
          return pNVar9;
        }
        StandardChars<char16_t>::SetNonNewline
                  (this->standardChars,this->ctAllocator,(CharSet<char16_t> *)this_01);
        return pNVar9;
      }
      if (cc == L'D') {
        StandardChars<char16_t>::SetNonDigits
                  (this->standardChars,this->ctAllocator,(CharSet<char16_t> *)this_01);
        return pNVar9;
      }
    }
    else {
      if (cc == L'S') {
        StandardChars<char16_t>::SetNonWhitespace
                  (this->standardChars,this->ctAllocator,(CharSet<char16_t> *)this_01);
        return pNVar9;
      }
      if (cc == L'W') {
        StandardChars<char16_t>::SetNonWordChars
                  (this->standardChars,this->ctAllocator,(CharSet<char16_t> *)this_01);
        return pNVar9;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc65,"(false)","");
    if (bVar2) {
      *puVar8 = 0;
      return pNVar9;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Node* Parser<P, IsLiteral>::GetNodeWithValidCharacterSet(EncodedChar cc)
    {
        Node* nodeToReturn = nullptr;
        if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && this->unicodeFlagPresent)
        {
            MatchSetNode *lowerRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            lowerRangeNode->set.SetRange(ctAllocator, (Char)0xD800, (Char)0xDBFF);
            MatchSetNode *upperRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            upperRangeNode->set.SetRange(ctAllocator, (Char)0xDC00, (Char)0xDFFF);

            ConcatNode* surrogateRangePairNode = Anew(ctAllocator, ConcatNode, lowerRangeNode, Anew(ctAllocator, ConcatNode, upperRangeNode, nullptr));

            // The MatchSet node will be split into [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) as a prefix, and a suffix of [D800-DBFF]
            // i.e. The MatchSet node can be with [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) OR [D800-DBFF]
            MatchSetNode* partialPrefixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'W':
                if (this->caseInsensitiveFlagPresent)
                {
                    standardChars->SetNonWordIUChars(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonWordChars(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            default:
                AssertMsg(false, "");
            }

            partialPrefixSetNode->set.SubtractRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            MatchSetNode* partialSuffixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            partialSuffixSetNode->set.SetRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            AltNode* altNode = Anew(ctAllocator, AltNode, partialPrefixSetNode, Anew(ctAllocator, AltNode, surrogateRangePairNode, Anew(ctAllocator, AltNode, partialSuffixSetNode, nullptr)));
            nodeToReturn = altNode;
        }
        else
        {
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, setNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, setNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, setNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, setNode->set);
                break;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, setNode->set);
                break;
            default:
                AssertMsg(false, "");
            }
            nodeToReturn = setNode;
        }

        return nodeToReturn;
    }